

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void eye_scale(double *mat,int N,double lambda)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (0 < N) {
    uVar2 = (ulong)(uint)N;
    uVar3 = 0;
    do {
      uVar4 = 0;
      do {
        dVar1 = lambda;
        if (uVar3 != uVar4) {
          dVar1 = 0.0;
        }
        mat[uVar4] = dVar1;
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      uVar3 = uVar3 + 1;
      mat = mat + uVar2;
    } while (uVar3 != uVar2);
  }
  return;
}

Assistant:

void eye_scale(double *mat, int N, double lambda) {
	int i, j, t;
	for (i = 0; i < N; ++i) {
		for (j = 0; j < N; ++j) {
			t = i*N;
			if (i == j) {
				mat[t + j] = lambda;
			}
			else {
				mat[t + j] = 0.;
			}
		}

	}
}